

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL is_var_in_arg_scope(JSVarDef *vd)

{
  bool local_9;
  JSVarDef *vd_local;
  
  local_9 = true;
  if ((((vd->var_name != 0x73) && (local_9 = true, vd->var_name != 0x72)) &&
      (local_9 = true, vd->var_name != 0x71)) &&
     ((local_9 = true, vd->var_name != 8 && (local_9 = true, vd->var_name != 0x53)))) {
    local_9 = (*(uint *)&vd->field_0xc >> 3 & 0xf) == 4;
  }
  return (BOOL)local_9;
}

Assistant:

static BOOL is_var_in_arg_scope(const JSVarDef *vd)
{
    return (vd->var_name == JS_ATOM_home_object ||
            vd->var_name == JS_ATOM_this_active_func ||
            vd->var_name == JS_ATOM_new_target ||
            vd->var_name == JS_ATOM_this ||
            vd->var_name == JS_ATOM__arg_var_ ||
            vd->var_kind == JS_VAR_FUNCTION_NAME);
}